

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O1

RecyclerWeakReference<Js::DynamicObject> * __thiscall
Js::DynamicObject::CreateWeakReferenceToSelf(DynamicObject *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *recycler;
  RecyclerWeakReferenceBase *weakRef;
  
  bVar2 = ThreadContext::IsOnStack(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x403,"(!ThreadContext::IsOnStack(this))",
                                "!ThreadContext::IsOnStack(this)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  recycler = RecyclableObject::GetRecycler(&this->super_RecyclableObject);
  weakRef = Memory::WeakReferenceHashTable<PrimePolicy>::Add
                      (&recycler->weakReferenceMap,(char *)this,recycler);
  if (weakRef->typeInfo == (Type)0x0) {
    weakRef->typeInfo = (Type)&typeinfo;
    Memory::Recycler::TrackAllocWeakRef(recycler,weakRef);
  }
  return (RecyclerWeakReference<Js::DynamicObject> *)weakRef;
}

Assistant:

RecyclerWeakReference<DynamicObject>* DynamicObject::CreateWeakReferenceToSelf()
    {
        Assert(!ThreadContext::IsOnStack(this));
        return GetRecycler()->CreateWeakReferenceHandle(this);
    }